

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::export_to_file(NaVector *this,char *szFilePath)

{
  uint uVar1;
  undefined4 *puVar2;
  FILE *__stream;
  char *in_RSI;
  long *in_RDI;
  uint i;
  FILE *fp;
  uint local_1c;
  
  if (in_RSI == (char *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  __stream = fopen(in_RSI,"wt");
  if (__stream == (FILE *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 5;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  uVar1 = (**(code **)(*in_RDI + 0x30))();
  fprintf(__stream,"%u\n",(ulong)uVar1);
  local_1c = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if (uVar1 <= local_1c) break;
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_1c);
    fprintf(__stream,"%g\n");
    local_1c = local_1c + 1;
  }
  fclose(__stream);
  return;
}

Assistant:

void
NaVector::export_to_file (const char* szFilePath) const
{
    if(NULL == szFilePath)
        throw(na_null_pointer);

    FILE    *fp = fopen(szFilePath, "wt");
    if(NULL == fp)
        throw(na_cant_open_file);

    fprintf(fp, "%u\n", dim());

    unsigned    i;
    for(i = 0; i < dim(); ++i){
         fprintf(fp, "%g\n", get(i));
    }

    fclose(fp);
}